

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawdata_create.c
# Opt level: O2

int rd_dimensions(mpt_rawdata *ptr,int part)

{
  _mpt_vptr_rawdata *p_Var1;
  int iVar2;
  
  p_Var1 = ptr[2]._vptr;
  if (p_Var1 == (_mpt_vptr_rawdata *)0x0) {
    iVar2 = -4;
  }
  else {
    if (part < 0) {
      part = *(int *)&ptr[3]._vptr;
    }
    if (part < (int)((ulong)p_Var1->dimension_count >> 4)) {
      if ((&p_Var1->stage_count)[(long)part * 2] != (_func_int_mpt_rawdata_ptr *)0x0) {
        return (int)(*(ulong *)((&p_Var1->stage_count)[(long)part * 2] + 0x18) >> 4);
      }
      return 0;
    }
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

static int rd_dimensions(const MPT_INTERFACE(rawdata) *ptr, int part)
{
	const MPT_STRUCT(RawData) *rd = MPT_baseaddr(RawData, ptr, _rd);
	const MPT_STRUCT(buffer) *buf;
	const MPT_STRUCT(rawdata_stage) *st;
	int max;
	
	if (!(buf = rd->st._buf)) {
		return MPT_ERROR(BadOperation);
	}
	st = (void *) (buf + 1);
	max = buf->_used / sizeof(*st);
	
	if (part < 0) {
		part = rd->act;
	}
	if (part >= max) {
		return MPT_ERROR(BadValue);
	}
	if (!(buf = st[part]._d._buf)) {
		return 0;
	}
	return buf->_used / sizeof(MPT_STRUCT(value_store));
}